

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System_test.cc
# Opt level: O3

void __thiscall EntitiesFixture::EntitiesFixture(EntitiesFixture *this)

{
  pointer *ppEVar1;
  iterator __position;
  int i;
  uint uVar2;
  Entity e;
  int local_50 [2];
  Entity local_48;
  vector<entityx::Entity,std::allocator<entityx::Entity>> *local_38;
  
  entityx::EntityX::EntityX(&this->super_EntityX);
  local_38 = (vector<entityx::Entity,std::allocator<entityx::Entity>> *)&this->created_entities;
  (this->created_entities).super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->created_entities).super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->created_entities).super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0;
  do {
    local_48 = entityx::EntityManager::create(&(this->super_EntityX).entities);
    __position._M_current =
         (this->created_entities).
         super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->created_entities).
        super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<entityx::Entity,std::allocator<entityx::Entity>>::
      _M_realloc_insert<entityx::Entity_const&>(local_38,__position,&local_48);
    }
    else {
      (__position._M_current)->manager_ = local_48.manager_;
      ((__position._M_current)->id_).id_ = local_48.id_.id_;
      ppEVar1 = &(this->created_entities).
                 super__Vector_base<entityx::Entity,_std::allocator<entityx::Entity>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
    if ((uVar2 & 1) == 0) {
      local_50[0] = 1;
      local_50[1] = 2;
      entityx::EntityManager::assign<Position,int,int>
                (local_48.manager_,local_48.id_,local_50,local_50 + 1);
    }
    if ((char)((char)((uVar2 & 0xff) / 3) * -3 + (char)uVar2) == '\0') {
      local_50[0] = 1;
      local_50[1] = 1;
      entityx::EntityManager::assign<Direction,int,int>
                (local_48.manager_,local_48.id_,local_50,local_50 + 1);
    }
    local_50[0] = 0;
    entityx::EntityManager::assign<Counter,int>(local_48.manager_,local_48.id_,local_50);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x96);
  return;
}

Assistant:

EntitiesFixture() {
    for (int i = 0; i < 150; ++i) {
      Entity e = entities.create();
      created_entities.push_back(e);
      if (i % 2 == 0) e.assign<Position>(1, 2);
      if (i % 3 == 0) e.assign<Direction>(1, 1);

      e.assign<Counter>(0);
    }
  }